

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.h
# Opt level: O0

unsigned_long axl::cry::failWithLastCryptoError<unsigned_long>(unsigned_long failResult)

{
  unsigned_long in_RDI;
  
  setLastCryptoError();
  return in_RDI;
}

Assistant:

T
failWithLastCryptoError(T failResult) {
	setLastCryptoError();
	return failResult;
}